

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::DocumentProcessor::addInstanceJoint
          (DocumentProcessor *this,KinematicInstance *instanceJoint)

{
  value_type *in_RDI;
  vector<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>
  *unaff_retaddr;
  
  KinematicsIntermediateData::getInstanceJoints((KinematicsIntermediateData *)in_RDI[0xc]);
  std::
  vector<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>::
  push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addInstanceJoint( KinematicInstance* instanceJoint ) { mKinematicsIntermediateData.getInstanceJoints().push_back(instanceJoint); }